

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_aggregates.cpp
# Opt level: O0

void duckdb::ListAggregateFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  Vector *in_stack_00000370;
  ExpressionState *in_stack_00000378;
  DataChunk *in_stack_00000380;
  
  ListAggregatesFunction<duckdb::AggregateFunctor,true>
            (in_stack_00000380,in_stack_00000378,in_stack_00000370);
  return;
}

Assistant:

static void ListAggregateFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(args.ColumnCount() >= 2);
	ListAggregatesFunction<AggregateFunctor, true>(args, state, result);
}